

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

spv_result_t
spvOperandTableValueLookup
          (spv_target_env param_1,spv_operand_table table,spv_operand_type_t type,uint32_t value,
          spv_operand_desc *pEntry)

{
  uint uVar1;
  spv_operand_desc_t *psVar2;
  spv_operand_desc_group_t *psVar3;
  spv_operand_desc_t *psVar4;
  spv_operand_desc_t *it;
  spv_operand_desc_t *end;
  spv_operand_desc_t *beg;
  spv_operand_desc_group_t *group;
  uint64_t typeIndex;
  char *pcStack_98;
  anon_class_1_0_00000001_for__M_comp comp;
  spv_operand_desc_t needle;
  spv_operand_desc *pEntry_local;
  uint32_t value_local;
  spv_operand_type_t type_local;
  spv_operand_table table_local;
  spv_target_env param_1_local;
  
  if (table == (spv_operand_table)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_TABLE;
  }
  else if (pEntry == (spv_operand_desc *)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_POINTER;
  }
  else {
    memset(&stack0xffffffffffffff68,0,0x70);
    pcStack_98 = "";
    for (group = (spv_operand_desc_group_t *)0x0;
        group < (spv_operand_desc_group_t *)(ulong)table->count;
        group = (spv_operand_desc_group_t *)((long)&group->type + 1)) {
      psVar3 = table->types + (long)group;
      if (((type == psVar3->type) &&
          (psVar2 = psVar3->entries, uVar1 = psVar3->count,
          psVar4 = std::
                   lower_bound<spv_operand_desc_t_const*,spv_operand_desc_t,spvOperandTableValueLookup(spv_target_env,spv_operand_table_t_const*,spv_operand_type_t,unsigned_int,spv_operand_desc_t_const**)::__0>
                             (psVar3->entries,psVar2 + uVar1,&stack0xffffffffffffff68),
          psVar4 != psVar2 + uVar1)) && (psVar4->value == value)) {
        *pEntry = psVar4;
        return SPV_SUCCESS;
      }
    }
    table_local._4_4_ = SPV_ERROR_INVALID_LOOKUP;
  }
  return table_local._4_4_;
}

Assistant:

spv_result_t spvOperandTableValueLookup(spv_target_env,
                                        const spv_operand_table table,
                                        const spv_operand_type_t type,
                                        const uint32_t value,
                                        spv_operand_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  spv_operand_desc_t needle = {"", value, 0, nullptr, 0, nullptr, {}, ~0u, ~0u};

  auto comp = [](const spv_operand_desc_t& lhs, const spv_operand_desc_t& rhs) {
    return lhs.value < rhs.value;
  };

  for (uint64_t typeIndex = 0; typeIndex < table->count; ++typeIndex) {
    const auto& group = table->types[typeIndex];
    if (type != group.type) continue;

    const auto beg = group.entries;
    const auto end = group.entries + group.count;

    // Assumes the underlying table is already sorted ascendingly according to
    // opcode value.
    auto it = std::lower_bound(beg, end, needle, comp);
    if (it != end && it->value == value) {
      // The current operand is considered available as long as
      // it is in the grammar.  It might not be *valid* to use,
      // but that should be checked by the validator, not by parsing.
      *pEntry = it;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}